

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O2

void __thiscall
icu_63::SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder
          (SimpleFilteredBreakIteratorBuilder *this,Locale *fromLocale,UErrorCode *status)

{
  char *localeID;
  UResourceBundle *p;
  LocalPointerBase<UResourceBundle> fillIn;
  UErrorCode subStatus;
  LocalUResourceBundlePointer breaks;
  LocalUResourceBundlePointer exceptions;
  LocalUResourceBundlePointer b;
  UnicodeString str;
  UErrorCode local_94;
  LocalPointerBase<UResourceBundle> local_90;
  LocalPointerBase<UResourceBundle> local_88;
  LocalPointerBase<UResourceBundle> local_80;
  LocalPointerBase<UResourceBundle> local_78;
  UnicodeString local_70;
  
  (this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleFilteredBreakIteratorBuilder_002462d0;
  UStringSet::UStringSet(&this->fSet,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_94 = U_ZERO_ERROR;
    localeID = Locale::getBaseName(fromLocale);
    local_78.ptr = ures_open_63("icudt63l-brkitr",localeID,&local_94);
    if (local_94 < U_ILLEGAL_ARGUMENT_ERROR && local_94 != U_USING_DEFAULT_WARNING) {
      local_80.ptr = ures_getByKeyWithFallback_63
                               (local_78.ptr,"exceptions",(UResourceBundle *)0x0,&local_94);
      if (local_94 < U_ILLEGAL_ARGUMENT_ERROR && local_94 != U_USING_DEFAULT_WARNING) {
        local_88.ptr = ures_getByKeyWithFallback_63
                                 (local_80.ptr,"SentenceBreak",(UResourceBundle *)0x0,&local_94);
        if (local_94 < U_ILLEGAL_ARGUMENT_ERROR && local_94 != U_USING_DEFAULT_WARNING) {
          local_94 = *status;
          fillIn.ptr = (UResourceBundle *)0x0;
          do {
            local_90.ptr = (UResourceBundle *)0x0;
            p = ures_getNextResource_63(local_88.ptr,fillIn.ptr,&local_94);
            LocalUResourceBundlePointer::adoptInstead((LocalUResourceBundlePointer *)&local_90,p);
            if (local_94 < U_ILLEGAL_ARGUMENT_ERROR && local_90.ptr != (UResourceBundle *)0x0) {
              ures_getUnicodeString(&local_70,local_90.ptr,status);
              (*(this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject[3])
                        (this,&local_70,status);
              UnicodeString::~UnicodeString(&local_70);
            }
          } while ((local_90.ptr != (UResourceBundle *)0x0) &&
                  (fillIn.ptr = local_90.ptr, local_94 < U_ILLEGAL_ARGUMENT_ERROR));
          if ((U_ZERO_ERROR < local_94) &&
             ((local_94 != U_INDEX_OUTOFBOUNDS_ERROR && (*status < U_ILLEGAL_ARGUMENT_ERROR)))) {
            *status = local_94;
          }
          LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)&local_90);
        }
        else {
          *status = local_94;
        }
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&local_88);
      }
      else {
        *status = local_94;
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_80);
    }
    else {
      *status = local_94;
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_78);
  }
  return;
}

Assistant:

SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder(const Locale &fromLocale, UErrorCode &status)
  : fSet(status)
{
  if(U_SUCCESS(status)) {
    UErrorCode subStatus = U_ZERO_ERROR;
    LocalUResourceBundlePointer b(ures_open(U_ICUDATA_BRKITR, fromLocale.getBaseName(), &subStatus));
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open BUNDLE %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }
    LocalUResourceBundlePointer exceptions(ures_getByKeyWithFallback(b.getAlias(), "exceptions", NULL, &subStatus));
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open EXCEPTIONS %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }
    LocalUResourceBundlePointer breaks(ures_getByKeyWithFallback(exceptions.getAlias(), "SentenceBreak", NULL, &subStatus));

#if FB_DEBUG
    {
      UErrorCode subsub = subStatus;
      fprintf(stderr, "open SentenceBreak %s => %s, %s\n", fromLocale.getBaseName(), ures_getLocale(breaks.getAlias(), &subsub), u_errorName(subStatus));
    }
#endif
    
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }

    LocalUResourceBundlePointer strs;
    subStatus = status; // Pick up inherited warning status now 
    do {
      strs.adoptInstead(ures_getNextResource(breaks.getAlias(), strs.orphan(), &subStatus));
      if(strs.isValid() && U_SUCCESS(subStatus)) {
        UnicodeString str(ures_getUnicodeString(strs.getAlias(), &status));
        suppressBreakAfter(str, status); // load the string
      }
    } while (strs.isValid() && U_SUCCESS(subStatus));
    if(U_FAILURE(subStatus)&&subStatus!=U_INDEX_OUTOFBOUNDS_ERROR&&U_SUCCESS(status)) {
      status = subStatus;
    }
  }
}